

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_evaluate_nurbs.cpp
# Opt level: O3

bool ON_RemoveBezierSingAt1(int dim,int order,int cv_stride,double *cv)

{
  int iVar1;
  ulong uVar2;
  int ord0;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  double *pdVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  
  if (1 < order) {
    uVar7 = dim + 1;
    iVar1 = uVar7 * order;
    uVar2 = (ulong)(uint)order;
    if ((cv[(long)iVar1 + -1] == 0.0) && (!NAN(cv[(long)iVar1 + -1]))) {
      uVar2 = (ulong)(uint)order;
      uVar4 = (ulong)(order - 1);
      iVar5 = iVar1 - dim;
      do {
        if (uVar2 == 2) {
          return false;
        }
        uVar2 = uVar2 - 1;
        lVar10 = (long)dim;
        iVar6 = iVar5;
        while (bVar12 = lVar10 != 0, lVar10 = lVar10 + -1, bVar12) {
          lVar8 = (long)iVar6;
          iVar6 = iVar6 + 1;
          if (cv[lVar8] != 0.0) {
            return false;
          }
          if (NAN(cv[lVar8])) {
            return false;
          }
        }
        uVar11 = 0;
        pdVar9 = cv;
        do {
          if (-1 < dim) {
            uVar3 = 0;
            do {
              pdVar9[uVar3] =
                   (pdVar9[uVar3] * (double)(int)uVar2) / (double)((int)uVar2 - (int)uVar11);
              uVar3 = uVar3 + 1;
            } while (uVar7 != uVar3);
          }
          uVar11 = uVar11 + 1;
          pdVar9 = pdVar9 + cv_stride;
        } while (uVar11 != uVar4);
        iVar1 = iVar1 - uVar7;
        uVar4 = uVar4 - 1;
        iVar5 = iVar5 + ~dim;
      } while ((cv[(long)iVar1 + -1] == 0.0) && (!NAN(cv[(long)iVar1 + -1])));
    }
    if ((int)uVar2 < order) {
      do {
        uVar7 = (int)uVar2 + 1;
        ON_IncreaseBezierDegree(dim,true,(int)uVar2,cv_stride,cv);
        uVar2 = (ulong)uVar7;
      } while (order != uVar7);
    }
  }
  return false;
}

Assistant:

bool ON_RemoveBezierSingAt1(
                  int dim, 
                  int order, 
                  int cv_stride,
                  double* cv
                  )
{
  const int cvdim = dim+1;
  int i,k,ord0,CVlen;
  ord0 = order;
  CVlen=order*cvdim;
  while (order > 1 && cv[CVlen-1] == 0.0) {
    order--;
    if (order < 2)
      return false;
    i = dim; 
    while(i--) {
      if (cv[CVlen-1-i] != 0.0)
        return false;
    }
    for (i=0;  i<order;  i++) {
      for (k=0;  k<cvdim;  k++) 
        cv[i*cv_stride+k] = (order*cv[i*cv_stride+k])/(order-i);
    }
    CVlen -= cvdim;
  }
  while(order < ord0)
    ON_IncreaseBezierDegree(dim,true,order++,cv_stride,cv);
  return false;
}